

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_file.cpp
# Opt level: O1

void __thiscall
MemoryFile_WriteToInitiallyEmptyFile_Test::TestBody(MemoryFile_WriteToInitiallyEmptyFile_Test *this)

{
  long lVar1;
  long lVar2;
  long lVar3;
  pointer *__ptr;
  _Head_base<0UL,_testing::internal::GTestFlagSaver_*,_false> __ptr_00;
  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_00;
  pointer message;
  char *pcVar4;
  char *in_R9;
  pointer *__ptr_2;
  bool bVar5;
  AssertionResult gtest_ar_;
  AssertionResult gtest_ar;
  buffer buffer;
  size_t elements;
  in_memory mf;
  AssertHelper local_a8;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_a0;
  GTestFlagSaver *local_98;
  undefined1 local_90 [8];
  _Head_base<0UL,_testing::internal::GTestFlagSaver_*,_false> local_88;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_80;
  AssertHelper local_70;
  MemoryFile local_68;
  unsigned_long local_58;
  not_null<const_void_*> local_50;
  in_memory local_48;
  
  local_58 = 5;
  anon_unknown.dwarf_1432f::MemoryFile::make_buffer(&local_68,5);
  *(char *)((long)local_68.super_Test._vptr_Test + 4) = '\0';
  *(undefined4 *)local_68.super_Test._vptr_Test = 0;
  local_90 = (undefined1  [8])local_68.super_Test._vptr_Test;
  local_88._M_head_impl =
       (GTestFlagSaver *)
       local_68.super_Test.gtest_flag_saver_._M_t.
       super___uniq_ptr_impl<testing::internal::GTestFlagSaver,_std::default_delete<testing::internal::GTestFlagSaver>_>
       ._M_t.
       super__Tuple_impl<0UL,_testing::internal::GTestFlagSaver_*,_std::default_delete<testing::internal::GTestFlagSaver>_>
       .super__Head_base<0UL,_testing::internal::GTestFlagSaver_*,_false>._M_head_impl;
  if (local_68.super_Test.gtest_flag_saver_._M_t.
      super___uniq_ptr_impl<testing::internal::GTestFlagSaver,_std::default_delete<testing::internal::GTestFlagSaver>_>
      ._M_t.
      super__Tuple_impl<0UL,_testing::internal::GTestFlagSaver_*,_std::default_delete<testing::internal::GTestFlagSaver>_>
      .super__Head_base<0UL,_testing::internal::GTestFlagSaver_*,_false>._M_head_impl !=
      (__uniq_ptr_impl<testing::internal::GTestFlagSaver,_std::default_delete<testing::internal::GTestFlagSaver>_>
       )0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      *(int *)&(((string *)
                ((long)local_68.super_Test.gtest_flag_saver_._M_t.
                       super___uniq_ptr_impl<testing::internal::GTestFlagSaver,_std::default_delete<testing::internal::GTestFlagSaver>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_testing::internal::GTestFlagSaver_*,_std::default_delete<testing::internal::GTestFlagSaver>_>
                       .super__Head_base<0UL,_testing::internal::GTestFlagSaver_*,_false>.
                       _M_head_impl + 8))->_M_dataplus)._M_p =
           *(int *)&(((string *)
                     ((long)local_68.super_Test.gtest_flag_saver_._M_t.
                            super___uniq_ptr_impl<testing::internal::GTestFlagSaver,_std::default_delete<testing::internal::GTestFlagSaver>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_testing::internal::GTestFlagSaver_*,_std::default_delete<testing::internal::GTestFlagSaver>_>
                            .super__Head_base<0UL,_testing::internal::GTestFlagSaver_*,_false>.
                            _M_head_impl + 8))->_M_dataplus)._M_p + 1;
      UNLOCK();
    }
    else {
      *(int *)&(((string *)
                ((long)local_68.super_Test.gtest_flag_saver_._M_t.
                       super___uniq_ptr_impl<testing::internal::GTestFlagSaver,_std::default_delete<testing::internal::GTestFlagSaver>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_testing::internal::GTestFlagSaver_*,_std::default_delete<testing::internal::GTestFlagSaver>_>
                       .super__Head_base<0UL,_testing::internal::GTestFlagSaver_*,_false>.
                       _M_head_impl + 8))->_M_dataplus)._M_p =
           *(int *)&(((string *)
                     ((long)local_68.super_Test.gtest_flag_saver_._M_t.
                            super___uniq_ptr_impl<testing::internal::GTestFlagSaver,_std::default_delete<testing::internal::GTestFlagSaver>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_testing::internal::GTestFlagSaver_*,_std::default_delete<testing::internal::GTestFlagSaver>_>
                            .super__Head_base<0UL,_testing::internal::GTestFlagSaver_*,_false>.
                            _M_head_impl + 8))->_M_dataplus)._M_p + 1;
    }
  }
  pstore::file::in_memory::in_memory(&local_48,(shared_ptr<void> *)local_90,5,0,true);
  if (local_88._M_head_impl != (GTestFlagSaver *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_88._M_head_impl);
  }
  local_a0._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x8;
  testing::internal::CmpHelperGE<unsigned_long,unsigned_long>
            ((internal *)local_90,"sizeof (source)","elements",(unsigned_long *)&local_a0,&local_58)
  ;
  if (local_90[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_a0);
    if (local_88._M_head_impl == (GTestFlagSaver *)0x0) {
      message = "";
    }
    else {
      message = ((_Alloc_hider *)&(local_88._M_head_impl)->also_run_disabled_tests_)->_M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_a8,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/os/test_file.cpp"
               ,0x1de,message);
    testing::internal::AssertHelper::operator=(&local_a8,(Message *)&local_a0);
    testing::internal::AssertHelper::~AssertHelper(&local_a8);
    if (local_a0._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_a0._M_head_impl + 8))();
    }
    if (local_88._M_head_impl == (GTestFlagSaver *)0x0) goto LAB_00128780;
    this_00 = (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&local_88;
    __ptr_00._M_head_impl = local_88._M_head_impl;
  }
  else {
    if (local_88._M_head_impl != (GTestFlagSaver *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_88,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   local_88._M_head_impl);
    }
    local_50.ptr_ = "Hello";
    pstore::gsl::not_null<const_void_*>::ensure_invariant(&local_50);
    pstore::file::in_memory::write_buffer(&local_48,local_50,5);
    local_a8.data_._0_4_ = 5;
    local_a0._M_head_impl =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_48.pos_;
    testing::internal::CmpHelperEQ<unsigned_int,unsigned_long>
              ((internal *)local_90,"5U","mf.tell ()",(uint *)&local_a8,(unsigned_long *)&local_a0);
    if (local_90[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_a0);
      if (local_88._M_head_impl == (GTestFlagSaver *)0x0) {
        pcVar4 = "";
      }
      else {
        pcVar4 = ((_Alloc_hider *)&(local_88._M_head_impl)->also_run_disabled_tests_)->_M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_a8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/os/test_file.cpp"
                 ,0x1e0,pcVar4);
      testing::internal::AssertHelper::operator=(&local_a8,(Message *)&local_a0);
      testing::internal::AssertHelper::~AssertHelper(&local_a8);
      if (local_a0._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_a0._M_head_impl + 8))();
      }
    }
    if (local_88._M_head_impl != (GTestFlagSaver *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_88,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   local_88._M_head_impl);
    }
    local_a8.data_._0_4_ = 5;
    local_a0._M_head_impl =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_48.eof_;
    testing::internal::CmpHelperEQ<unsigned_int,unsigned_long>
              ((internal *)local_90,"5U","mf.size ()",(uint *)&local_a8,(unsigned_long *)&local_a0);
    if (local_90[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_a0);
      if (local_88._M_head_impl == (GTestFlagSaver *)0x0) {
        pcVar4 = "";
      }
      else {
        pcVar4 = ((_Alloc_hider *)&(local_88._M_head_impl)->also_run_disabled_tests_)->_M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_a8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/os/test_file.cpp"
                 ,0x1e1,pcVar4);
      testing::internal::AssertHelper::operator=(&local_a8,(Message *)&local_a0);
      testing::internal::AssertHelper::~AssertHelper(&local_a8);
      if (local_a0._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_a0._M_head_impl + 8))();
      }
    }
    if (local_88._M_head_impl != (GTestFlagSaver *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_88,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   local_88._M_head_impl);
    }
    if (*(char *)local_68.super_Test._vptr_Test == 'H') {
      lVar3 = 0;
      do {
        bVar5 = lVar3 == 4;
        if (bVar5) goto LAB_001286c9;
        lVar1 = lVar3 + 1;
        lVar2 = lVar3 + 1;
        lVar3 = lVar3 + 1;
      } while ((uint)*(byte *)((long)local_68.super_Test._vptr_Test + lVar1) == (int)"Hello"[lVar2])
      ;
    }
    bVar5 = false;
LAB_001286c9:
    this_00 = (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&local_98;
    local_a0._M_head_impl._0_1_ = bVar5;
    local_98 = (GTestFlagSaver *)0x0;
    if (bVar5 == false) {
      testing::Message::Message((Message *)&local_a8);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_90,(internal *)&local_a0,
                 (AssertionResult *)"std::equal (buffer.get (), buffer.get () + elements, source)",
                 "false","true",in_R9);
      testing::internal::AssertHelper::AssertHelper
                (&local_70,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/os/test_file.cpp"
                 ,0x1e3,(char *)local_90);
      testing::internal::AssertHelper::operator=(&local_70,(Message *)&local_a8);
      testing::internal::AssertHelper::~AssertHelper(&local_70);
      if (local_90 != (undefined1  [8])&local_80) {
        operator_delete((void *)local_90,local_80._M_allocated_capacity + 1);
      }
      if ((long *)CONCAT44(local_a8.data_._4_4_,local_a8.data_._0_4_) != (long *)0x0) {
        (**(code **)(*(long *)CONCAT44(local_a8.data_._4_4_,local_a8.data_._0_4_) + 8))();
      }
    }
    __ptr_00._M_head_impl = local_98;
    if (local_98 == (GTestFlagSaver *)0x0) goto LAB_00128780;
  }
  std::
  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  operator()(this_00,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     __ptr_00._M_head_impl);
LAB_00128780:
  if (local_48.buffer_.super___shared_ptr<unsigned_char,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_48.buffer_.super___shared_ptr<unsigned_char,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  pstore::file::file_base::~file_base(&local_48.super_file_base);
  if ((__uniq_ptr_impl<testing::internal::GTestFlagSaver,_std::default_delete<testing::internal::GTestFlagSaver>_>
       )local_68.super_Test.gtest_flag_saver_._M_t.
        super___uniq_ptr_impl<testing::internal::GTestFlagSaver,_std::default_delete<testing::internal::GTestFlagSaver>_>
        ._M_t.
        super__Tuple_impl<0UL,_testing::internal::GTestFlagSaver_*,_std::default_delete<testing::internal::GTestFlagSaver>_>
        .super__Head_base<0UL,_testing::internal::GTestFlagSaver_*,_false>._M_head_impl !=
      (__uniq_ptr_impl<testing::internal::GTestFlagSaver,_std::default_delete<testing::internal::GTestFlagSaver>_>
       )0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               local_68.super_Test.gtest_flag_saver_._M_t.
               super___uniq_ptr_impl<testing::internal::GTestFlagSaver,_std::default_delete<testing::internal::GTestFlagSaver>_>
               ._M_t.
               super__Tuple_impl<0UL,_testing::internal::GTestFlagSaver_*,_std::default_delete<testing::internal::GTestFlagSaver>_>
               .super__Head_base<0UL,_testing::internal::GTestFlagSaver_*,_false>._M_head_impl);
  }
  return;
}

Assistant:

TEST_F (MemoryFile, WriteToInitiallyEmptyFile) {
    constexpr std::size_t elements = 5;
    auto buffer = MemoryFile::make_buffer (elements);
    std::fill (buffer.get (), buffer.get () + elements, std::uint8_t{0});
    pstore::file::in_memory mf (buffer, elements);

    char const * source = "Hello";
    ASSERT_GE (sizeof (source), elements);
    mf.write_buffer (source, elements);
    EXPECT_EQ (5U, mf.tell ());
    EXPECT_EQ (5U, mf.size ());

    EXPECT_TRUE (std::equal (buffer.get (), buffer.get () + elements, source));
}